

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeFreeCursorNN(Vdbe *p,VdbeCursor *pCx)

{
  u8 uVar1;
  BtCursor *pBVar2;
  long lVar3;
  sqlite3_module *pModule;
  sqlite3_vtab_cursor *pVCur;
  VdbeCursor *pCx_local;
  Vdbe *p_local;
  
  uVar1 = pCx->eCurType;
  if (uVar1 == '\0') {
    sqlite3BtreeCloseCursor((pCx->uc).pCursor);
  }
  else if (uVar1 == '\x01') {
    sqlite3VdbeSorterClose(p->db,pCx);
  }
  else if (uVar1 == '\x02') {
    pBVar2 = (pCx->uc).pCursor;
    lVar3 = **(long **)pBVar2;
    *(int *)(*(long *)pBVar2 + 8) = *(int *)(*(long *)pBVar2 + 8) + -1;
    (**(code **)(lVar3 + 0x38))(pBVar2);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeFreeCursorNN(Vdbe *p, VdbeCursor *pCx){
  switch( pCx->eCurType ){
    case CURTYPE_SORTER: {
      sqlite3VdbeSorterClose(p->db, pCx);
      break;
    }
    case CURTYPE_BTREE: {
      assert( pCx->uc.pCursor!=0 );
      sqlite3BtreeCloseCursor(pCx->uc.pCursor);
      break;
    }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    case CURTYPE_VTAB: {
      sqlite3_vtab_cursor *pVCur = pCx->uc.pVCur;
      const sqlite3_module *pModule = pVCur->pVtab->pModule;
      assert( pVCur->pVtab->nRef>0 );
      pVCur->pVtab->nRef--;
      pModule->xClose(pVCur);
      break;
    }
#endif
  }
}